

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O3

int run_test_tcp_local_connect_timeout(void)

{
  short sVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  short *psVar5;
  ulong uVar6;
  uv_handle_t *unaff_RBX;
  uv_connect_t *puVar7;
  uv_tcp_t *puVar8;
  undefined8 unaff_R14;
  bool bVar9;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 auStack_4b8 [56];
  undefined8 uStack_480;
  uv_alloc_cb p_Stack_470;
  uv_read_cb p_Stack_468;
  undefined1 auStack_458 [16];
  undefined8 uStack_448;
  undefined3 uStack_440;
  undefined5 uStack_43d;
  undefined3 uStack_438;
  char acStack_340 [768];
  uv_handle_t *puStack_40;
  long local_30;
  long local_28;
  undefined1 local_20 [16];
  
  puStack_40 = (uv_handle_t *)0x1cb088;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    puStack_40 = (uv_handle_t *)0x1cb241;
    run_test_tcp_local_connect_timeout_cold_9();
    return 7;
  }
  puStack_40 = (uv_handle_t *)0x1cb0a6;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_20);
  local_28 = (long)iVar2;
  local_30 = 0;
  if (local_28 == 0) {
    puStack_40 = (uv_handle_t *)0x1cb0cb;
    uVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1cb0da;
    iVar2 = uv_timer_init(uVar3,&timer);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001cb25e;
    puStack_40 = (uv_handle_t *)0x1cb114;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001cb26d;
    puStack_40 = (uv_handle_t *)0x1cb139;
    uVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1cb148;
    iVar2 = uv_tcp_init(uVar3,&conn);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001cb27c;
    puStack_40 = (uv_handle_t *)0x1cb187;
    iVar2 = uv_tcp_connect(&connect_req,&conn,local_20,connect_local_cb);
    if (iVar2 == -0x65) {
      puStack_40 = (uv_handle_t *)0x1cb248;
      run_test_tcp_local_connect_timeout_cold_8();
      return 7;
    }
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001cb28b;
    puStack_40 = (uv_handle_t *)0x1cb1b5;
    uVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1cb1bf;
    iVar2 = uv_run(uVar3,0);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001cb29a;
    puStack_40 = (uv_handle_t *)0x1cb1e4;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_handle_t *)0x0;
    puStack_40 = (uv_handle_t *)0x1cb1fa;
    uv_walk(unaff_R14,close_walk_cb,0);
    puStack_40 = (uv_handle_t *)0x1cb204;
    uv_run(unaff_R14,0);
    local_28 = 0;
    puStack_40 = (uv_handle_t *)0x1cb212;
    uVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1cb21a;
    iVar2 = uv_loop_close(uVar3);
    local_30 = (long)iVar2;
    if (local_28 == local_30) {
      puStack_40 = (uv_handle_t *)0x1cb232;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_40 = (uv_handle_t *)0x1cb25e;
    run_test_tcp_local_connect_timeout_cold_1();
LAB_001cb25e:
    puStack_40 = (uv_handle_t *)0x1cb26d;
    run_test_tcp_local_connect_timeout_cold_2();
LAB_001cb26d:
    puStack_40 = (uv_handle_t *)0x1cb27c;
    run_test_tcp_local_connect_timeout_cold_3();
LAB_001cb27c:
    puStack_40 = (uv_handle_t *)0x1cb28b;
    run_test_tcp_local_connect_timeout_cold_4();
LAB_001cb28b:
    puStack_40 = (uv_handle_t *)0x1cb29a;
    run_test_tcp_local_connect_timeout_cold_5();
LAB_001cb29a:
    puStack_40 = (uv_handle_t *)0x1cb2a9;
    run_test_tcp_local_connect_timeout_cold_6();
  }
  puStack_40 = (uv_handle_t *)is_supported_system;
  run_test_tcp_local_connect_timeout_cold_7();
  p_Stack_468 = (uv_read_cb)0x1cb2ca;
  puStack_40 = unaff_RBX;
  iVar2 = uv_os_uname(&uStack_440);
  auStack_458._0_8_ = SEXT48(iVar2);
  uStack_448 = (uv__queue *)0x0;
  if ((uv_shutdown_t *)auStack_458._0_8_ == (uv_shutdown_t *)0x0) {
    if (CONCAT35(uStack_438,uStack_43d) == 0x544e5f73776f64 &&
        CONCAT53(uStack_43d,uStack_440) == 0x5f73776f646e6957) {
      p_Stack_468 = (uv_read_cb)0x1cb344;
      iVar2 = sscanf(acStack_340,"%d.%d.%d",auStack_458,auStack_458 + 4,auStack_458 + 8);
      if (iVar2 != 3) {
        return 0;
      }
      lVar4 = 0;
      do {
        if (*(int *)((long)&DAT_001f6c00 + lVar4) < *(int *)(auStack_458 + lVar4)) {
          return 1;
        }
        if (*(int *)(auStack_458 + lVar4) < *(int *)((long)&DAT_001f6c00 + lVar4)) {
          return 0;
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
    }
    return 1;
  }
  puVar7 = (uv_connect_t *)auStack_458;
  iVar2 = (int)&uStack_448;
  p_Stack_468 = connect_local_cb;
  is_supported_system_cold_1();
  if (puVar7 == &connect_req) {
    p_Stack_468 = (uv_read_cb)(long)iVar2;
    p_Stack_470 = (uv_alloc_cb)0xffffffffffffff83;
    if (p_Stack_468 != (uv_read_cb)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    uStack_480._0_4_ = 0x1cb3bb;
    uStack_480._4_4_ = 0;
    connect_local_cb_cold_1();
  }
  uStack_480 = run_test_tcp6_local_connect_timeout;
  connect_local_cb_cold_2();
  auStack_4b8._48_8_ = unaff_RBX;
  uStack_480 = (code *)unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 7;
  }
  iVar2 = uv_interface_addresses(auStack_4b8 + 0x10,auStack_4b8);
  if (iVar2 != 0) {
LAB_001cb5ed:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 7;
  }
  if ((long)(int)auStack_4b8._0_4_ < 1) {
    uv_free_interface_addresses();
    goto LAB_001cb5ed;
  }
  psVar5 = (short *)(auStack_4b8._16_8_ + 0x14);
  uVar6 = 1;
  do {
    sVar1 = *psVar5;
    if (sVar1 == 10) break;
    psVar5 = psVar5 + 0x30;
    bVar9 = uVar6 < (ulong)(long)(int)auStack_4b8._0_4_;
    uVar6 = uVar6 + 1;
  } while (bVar9);
  uv_free_interface_addresses();
  if (sVar1 != 10) goto LAB_001cb5ed;
  iVar2 = uv_ip6_addr("::1",9999,auStack_4b8 + 0x10);
  auStack_4b8._0_8_ = SEXT48(iVar2);
  auStack_4b8._8_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_4b8._0_8_ == (uv_loop_t *)0x0) {
    uVar3 = uv_default_loop();
    iVar2 = uv_timer_init(uVar3,&timer);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001cb617;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001cb626;
    uVar3 = uv_default_loop();
    iVar2 = uv_tcp_init(uVar3,&conn);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001cb635;
    iVar2 = uv_tcp_connect(&connect_req,&conn,auStack_4b8 + 0x10,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 7;
    }
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001cb644;
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ == (uv_loop_t *)0x0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      auStack_4b8._0_8_ = (uv_loop_t *)0x0;
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      auStack_4b8._8_8_ = SEXT48(iVar2);
      if (auStack_4b8._0_8_ == auStack_4b8._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001cb662;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_001cb617:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_001cb626:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_001cb635:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_001cb644:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_001cb662:
  puVar8 = (uv_tcp_t *)auStack_4b8;
  run_test_tcp6_local_connect_timeout_cold_8();
  if (puVar8 == (uv_tcp_t *)&timer || puVar8 == &conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x37f0,puVar8 == &conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(puVar8,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_local_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}